

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  int local_eec;
  int local_ebc;
  int local_ea0;
  int local_e9c;
  ulong local_e90;
  ulong local_e80;
  ulong local_e70;
  int local_e54;
  void *local_e50;
  ulong local_e40;
  size_t storage_ix_1;
  uint8_t *storage_1;
  uint local_e28;
  uint32_t metablock_size;
  int should_flush;
  int next_input_fits_metablock;
  size_t processed_bytes;
  size_t max_commands;
  size_t max_literals;
  size_t max_length;
  Command *new_commands;
  size_t newsize;
  int *table;
  size_t table_size;
  size_t storage_ix;
  uint8_t *storage;
  MemoryManager *m;
  uint8_t *puStack_dc0;
  uint32_t mask;
  uint8_t *data;
  uint32_t wrapped_last_processed_pos;
  uint32_t bytes;
  uint64_t delta;
  uint8_t **output_local;
  size_t *out_size_local;
  int force_flush_local;
  int is_last_local;
  BrotliEncoderState *s_local;
  BrotliEncoderState *local_d80;
  int local_d74;
  BrotliEncoderState *local_d70;
  int local_d68;
  int local_d64;
  Hashers *local_d60;
  int local_d54;
  Hashers *local_d50;
  ulong local_d48;
  Command *local_d40;
  undefined2 local_d34;
  ushort local_d32;
  uint16_t copycode;
  uint16_t *puStack_d30;
  uint16_t inscode;
  undefined4 local_d24;
  undefined8 local_d20;
  ulong local_d18;
  int local_d0c;
  ulong uStack_d08;
  uint32_t nbits;
  ushort local_cfe;
  undefined8 uStack_cf8;
  uint32_t nbits_1;
  undefined2 local_cf0;
  ushort local_cee;
  undefined4 local_cec;
  uint16_t bits64;
  ushort local_ce4;
  ushort local_ce2;
  long local_cd0;
  long local_cc8;
  int local_cc0;
  int local_cbc;
  int hasher_type;
  ulong local_cb0;
  BrotliEncoderState *local_ca8;
  ulong local_ca0;
  uint8_t *local_c98;
  Hashers *local_c90;
  uint8_t *local_c88;
  BrotliEncoderState *local_c80;
  int local_c74;
  ulong local_c70;
  size_t max_backward;
  size_t i;
  size_t i_end;
  size_t i_start;
  uint8_t *local_c48;
  ulong local_c40;
  ulong local_c38;
  H10 *local_c30;
  ulong local_c28;
  ulong local_c20;
  ulong local_c18;
  size_t len;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix;
  uint32_t key_36;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked;
  ulong *local_ba8;
  ulong local_ba0;
  long local_b98;
  size_t local_b90;
  size_t local_b88;
  uint8_t *local_b80;
  H10 *local_b78;
  size_t local_b70;
  size_t local_b68;
  undefined8 local_b60;
  undefined8 local_b58;
  size_t local_b50;
  H10 *local_b48;
  size_t local_b40;
  H10 *local_b38;
  ulong local_b30;
  H10 *local_b28;
  size_t local_b20;
  H10 *local_b18;
  size_t local_b10;
  H10 *local_b08;
  ulong local_b00;
  H10 *local_af8;
  ulong local_af0;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_ac8;
  uint8_t *local_ac0;
  size_t local_ab8;
  ulong local_ab0;
  uint64_t t_12;
  ulong local_aa0;
  uint64_t t_11;
  ulong local_a90;
  uint64_t t_10;
  ulong local_a80;
  uint64_t t_9;
  ulong local_a70;
  size_t local_a68;
  size_t local_a60;
  ulong local_a58;
  undefined8 local_a50;
  int local_a44;
  BrotliEncoderState *pBStack_a40;
  int bits;
  undefined4 local_a38;
  int local_a34;
  BrotliEncoderState *local_a30;
  int local_a28;
  int local_a24;
  ulong local_a20;
  uint8_t *local_a18;
  ulong local_a10;
  ulong local_a08;
  H2 *local_a00;
  undefined4 local_9f8;
  uint32_t local_9f4;
  uint32_t off_2;
  uint32_t key_2;
  ulong local_9e8;
  uint8_t *local_9e0;
  H2 *local_9d8;
  undefined4 local_9d0;
  uint32_t local_9cc;
  uint32_t off_1;
  uint32_t key_1;
  ulong local_9c0;
  uint8_t *local_9b8;
  H2 *local_9b0;
  undefined4 local_9a8;
  uint32_t local_9a4;
  uint32_t off;
  uint32_t key;
  ulong local_998;
  uint8_t *local_990;
  H2 *local_988;
  ulong local_980;
  uint8_t *local_978;
  ulong local_970;
  ulong local_968;
  H3 *local_960;
  uint local_958;
  uint32_t local_954;
  uint32_t off_5;
  uint32_t key_5;
  ulong local_948;
  uint8_t *local_940;
  H3 *local_938;
  uint local_930;
  uint32_t local_92c;
  uint32_t off_4;
  uint32_t key_4;
  ulong local_920;
  uint8_t *local_918;
  H3 *local_910;
  uint local_908;
  uint32_t local_904;
  uint32_t off_3;
  uint32_t key_3;
  ulong local_8f8;
  uint8_t *local_8f0;
  H3 *local_8e8;
  ulong local_8e0;
  uint8_t *local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  H4 *local_8c0;
  uint local_8b8;
  uint32_t local_8b4;
  uint32_t off_8;
  uint32_t key_8;
  ulong local_8a8;
  uint8_t *local_8a0;
  H4 *local_898;
  uint local_890;
  uint32_t local_88c;
  uint32_t off_7;
  uint32_t key_7;
  ulong local_880;
  uint8_t *local_878;
  H4 *local_870;
  uint local_868;
  uint32_t local_864;
  uint32_t off_6;
  uint32_t key_6;
  ulong local_858;
  uint8_t *local_850;
  H4 *local_848;
  ulong local_840;
  uint8_t *local_838;
  ulong local_830;
  ulong local_828;
  H5 *local_820;
  long local_818;
  size_t minor_ix_2;
  ulong uStack_808;
  uint32_t key_11;
  ulong local_800;
  uint8_t *local_7f8;
  H5 *local_7f0;
  long local_7e8;
  size_t minor_ix_1;
  ulong uStack_7d8;
  uint32_t key_10;
  ulong local_7d0;
  uint8_t *local_7c8;
  H5 *local_7c0;
  long local_7b8;
  size_t minor_ix;
  ulong uStack_7a8;
  uint32_t key_9;
  ulong local_7a0;
  uint8_t *local_798;
  H5 *local_790;
  ulong local_788;
  uint8_t *local_780;
  ulong local_778;
  ulong local_770;
  H6 *local_768;
  long local_760;
  size_t minor_ix_5;
  ulong uStack_750;
  uint32_t key_14;
  ulong local_748;
  uint8_t *local_740;
  H6 *local_738;
  long local_730;
  size_t minor_ix_4;
  ulong uStack_720;
  uint32_t key_13;
  ulong local_718;
  uint8_t *local_710;
  H6 *local_708;
  long local_700;
  size_t minor_ix_3;
  ulong uStack_6f0;
  uint32_t key_12;
  ulong local_6e8;
  uint8_t *local_6e0;
  H6 *local_6d8;
  ulong local_6d0;
  uint8_t *local_6c8;
  ulong local_6c0;
  ulong local_6b8;
  H7 *local_6b0;
  long local_6a8;
  size_t minor_ix_8;
  ulong uStack_698;
  uint32_t key_17;
  ulong local_690;
  uint8_t *local_688;
  H7 *local_680;
  long local_678;
  size_t minor_ix_7;
  ulong uStack_668;
  uint32_t key_16;
  ulong local_660;
  uint8_t *local_658;
  H7 *local_650;
  long local_648;
  size_t minor_ix_6;
  ulong uStack_638;
  uint32_t key_15;
  ulong local_630;
  uint8_t *local_628;
  H7 *local_620;
  ulong local_618;
  uint8_t *local_610;
  ulong local_608;
  ulong local_600;
  H8 *local_5f8;
  long local_5f0;
  size_t minor_ix_11;
  ulong uStack_5e0;
  uint32_t key_20;
  ulong local_5d8;
  uint8_t *local_5d0;
  H8 *local_5c8;
  long local_5c0;
  size_t minor_ix_10;
  ulong uStack_5b0;
  uint32_t key_19;
  ulong local_5a8;
  uint8_t *local_5a0;
  H8 *local_598;
  long local_590;
  size_t minor_ix_9;
  ulong uStack_580;
  uint32_t key_18;
  ulong local_578;
  uint8_t *local_570;
  H8 *local_568;
  ulong local_560;
  uint8_t *local_558;
  ulong local_550;
  ulong local_548;
  H9 *local_540;
  long local_538;
  size_t minor_ix_14;
  ulong uStack_528;
  uint32_t key_23;
  ulong local_520;
  uint8_t *local_518;
  H9 *local_510;
  long local_508;
  size_t minor_ix_13;
  ulong uStack_4f8;
  uint32_t key_22;
  ulong local_4f0;
  uint8_t *local_4e8;
  H9 *local_4e0;
  long local_4d8;
  size_t minor_ix_12;
  ulong uStack_4c8;
  uint32_t key_21;
  ulong local_4c0;
  uint8_t *local_4b8;
  H9 *local_4b0;
  ulong local_4a8;
  uint8_t *local_4a0;
  ulong local_498;
  ulong local_490;
  H40 *local_488;
  ulong local_480;
  size_t delta_3;
  size_t idx_2;
  size_t bank_2;
  size_t key_26;
  ulong local_458;
  uint8_t *local_450;
  H40 *local_448;
  ulong local_440;
  size_t delta_2;
  size_t idx_1;
  size_t bank_1;
  size_t key_25;
  ulong local_418;
  uint8_t *local_410;
  H40 *local_408;
  ulong local_400;
  size_t delta_1;
  size_t idx;
  size_t bank;
  size_t key_24;
  ulong local_3d8;
  uint8_t *local_3d0;
  H40 *local_3c8;
  uint local_3bc;
  int *piStack_3b8;
  uint32_t h;
  int local_3ac;
  int *piStack_3a8;
  uint32_t t;
  uint local_39c;
  int *piStack_398;
  uint32_t h_1;
  int local_38c;
  int *piStack_388;
  uint32_t t_1;
  uint local_37c;
  int *piStack_378;
  uint32_t h_2;
  int local_36c;
  int *piStack_368;
  uint32_t t_2;
  ulong local_360;
  uint8_t *local_358;
  ulong local_350;
  ulong local_348;
  H41 *local_340;
  ulong local_338;
  size_t delta_6;
  size_t idx_5;
  size_t bank_5;
  size_t key_29;
  ulong local_310;
  uint8_t *local_308;
  H41 *local_300;
  ulong local_2f8;
  size_t delta_5;
  size_t idx_4;
  size_t bank_4;
  size_t key_28;
  ulong local_2d0;
  uint8_t *local_2c8;
  H41 *local_2c0;
  ulong local_2b8;
  size_t delta_4;
  size_t idx_3;
  size_t bank_3;
  size_t key_27;
  ulong local_290;
  uint8_t *local_288;
  H41 *local_280;
  uint local_274;
  int *piStack_270;
  uint32_t h_3;
  int local_264;
  int *piStack_260;
  uint32_t t_3;
  uint local_254;
  int *piStack_250;
  uint32_t h_4;
  int local_244;
  int *piStack_240;
  uint32_t t_4;
  uint local_234;
  int *piStack_230;
  uint32_t h_5;
  int local_224;
  int *piStack_220;
  uint32_t t_5;
  ulong local_218;
  uint8_t *local_210;
  ulong local_208;
  ulong local_200;
  H42 *local_1f8;
  ulong local_1f0;
  size_t delta_9;
  size_t idx_8;
  size_t bank_8;
  size_t key_32;
  ulong local_1c8;
  uint8_t *local_1c0;
  H42 *local_1b8;
  ulong local_1b0;
  size_t delta_8;
  size_t idx_7;
  size_t bank_7;
  size_t key_31;
  ulong local_188;
  uint8_t *local_180;
  H42 *local_178;
  ulong local_170;
  size_t delta_7;
  size_t idx_6;
  size_t bank_6;
  size_t key_30;
  ulong local_148;
  uint8_t *local_140;
  H42 *local_138;
  uint local_12c;
  int *piStack_128;
  uint32_t h_6;
  int local_11c;
  int *piStack_118;
  uint32_t t_6;
  uint local_10c;
  int *piStack_108;
  uint32_t h_7;
  int local_fc;
  int *piStack_f8;
  uint32_t t_7;
  uint local_ec;
  int *piStack_e8;
  uint32_t h_8;
  int local_dc;
  int *piStack_d8;
  uint32_t t_8;
  ulong local_d0;
  uint8_t *local_c8;
  ulong local_c0;
  ulong local_b8;
  H54 *local_b0;
  uint local_a8;
  uint32_t local_a4;
  uint32_t off_11;
  uint32_t key_35;
  ulong local_98;
  uint8_t *local_90;
  H54 *local_88;
  uint local_80;
  uint32_t local_7c;
  uint32_t off_10;
  uint32_t key_34;
  ulong local_70;
  uint8_t *local_68;
  H54 *local_60;
  uint local_58;
  uint32_t local_54;
  uint32_t off_9;
  uint32_t key_33;
  ulong local_48;
  uint8_t *local_40;
  H54 *local_38;
  
  delta = (uint64_t)output;
  output_local = (uint8_t **)out_size;
  out_size_local._0_4_ = force_flush;
  out_size_local._4_4_ = is_last;
  _force_flush_local = s;
  _wrapped_last_processed_pos = UnprocessedInputSize(s);
  data._4_4_ = (uint)_wrapped_last_processed_pos;
  data._0_4_ = WrapPosition(_force_flush_local->last_processed_pos_);
  storage = (uint8_t *)&_force_flush_local->memory_manager_;
  iVar2 = EnsureInitialized(_force_flush_local);
  uVar7 = _wrapped_last_processed_pos;
  if (iVar2 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    puStack_dc0 = (_force_flush_local->ringbuffer_).buffer_;
    m._4_4_ = (_force_flush_local->ringbuffer_).mask_;
    if (_force_flush_local->is_last_block_emitted_ == 0) {
      if (out_size_local._4_4_ != 0) {
        _force_flush_local->is_last_block_emitted_ = 1;
      }
      sVar4 = InputBlockSize(_force_flush_local);
      if (sVar4 < uVar7) {
        s_local._4_4_ = 0;
      }
      else {
        if (((_force_flush_local->params).quality == 1) &&
           (_force_flush_local->command_buf_ == (uint32_t *)0x0)) {
          puVar5 = (uint32_t *)BrotliAllocate((MemoryManager *)storage,0x80000);
          _force_flush_local->command_buf_ = puVar5;
          puVar6 = (uint8_t *)BrotliAllocate((MemoryManager *)storage,0x20000);
          _force_flush_local->literal_buf_ = puVar6;
        }
        if (((_force_flush_local->params).quality == 0) ||
           ((_force_flush_local->params).quality == 1)) {
          table_size = (size_t)_force_flush_local->last_byte_bits_;
          if ((_wrapped_last_processed_pos == 0) && (out_size_local._4_4_ == 0)) {
            *output_local = (uint8_t *)0x0;
            s_local._4_4_ = 1;
          }
          else {
            storage_ix = (size_t)GetBrotliStorage(_force_flush_local,(ulong)(data._4_4_ * 2 + 0x1f6)
                                                 );
            *(uint8_t *)storage_ix = _force_flush_local->last_byte_;
            newsize = (size_t)GetHashTable(_force_flush_local,(_force_flush_local->params).quality,
                                           (ulong)data._4_4_,(size_t *)&table);
            if ((_force_flush_local->params).quality == 0) {
              BrotliCompressFragmentFast
                        ((MemoryManager *)storage,puStack_dc0 + ((uint32_t)data & m._4_4_),
                         (ulong)data._4_4_,out_size_local._4_4_,(int *)newsize,(size_t)table,
                         _force_flush_local->cmd_depths_,_force_flush_local->cmd_bits_,
                         &_force_flush_local->cmd_code_numbits_,_force_flush_local->cmd_code_,
                         &table_size,(uint8_t *)storage_ix);
            }
            else {
              BrotliCompressFragmentTwoPass
                        ((MemoryManager *)storage,puStack_dc0 + ((uint32_t)data & m._4_4_),
                         (ulong)data._4_4_,out_size_local._4_4_,_force_flush_local->command_buf_,
                         _force_flush_local->literal_buf_,(int *)newsize,(size_t)table,&table_size,
                         (uint8_t *)storage_ix);
            }
            _force_flush_local->last_byte_ = *(uint8_t *)(storage_ix + (table_size >> 3));
            _force_flush_local->last_byte_bits_ = (byte)table_size & 7;
            UpdateLastProcessedPos(_force_flush_local);
            *(size_t *)delta = storage_ix;
            *output_local = (uint8_t *)(table_size >> 3);
            s_local._4_4_ = 1;
          }
        }
        else {
          new_commands = (Command *)
                         (_force_flush_local->num_commands_ + (ulong)(data._4_4_ >> 1) + 1);
          if ((Command *)_force_flush_local->cmd_alloc_size_ < new_commands) {
            new_commands = (Command *)
                           ((long)&new_commands->insert_len_ + (ulong)((data._4_4_ >> 2) + 0x10));
            _force_flush_local->cmd_alloc_size_ = (size_t)new_commands;
            if (new_commands == (Command *)0x0) {
              local_e50 = (void *)0x0;
            }
            else {
              local_e50 = BrotliAllocate((MemoryManager *)storage,(long)new_commands * 0x10);
            }
            max_length = (size_t)local_e50;
            if (_force_flush_local->commands_ != (Command *)0x0) {
              memcpy(local_e50,_force_flush_local->commands_,_force_flush_local->num_commands_ << 4)
              ;
              BrotliFree((MemoryManager *)storage,_force_flush_local->commands_);
              _force_flush_local->commands_ = (Command *)0x0;
            }
            _force_flush_local->commands_ = (Command *)max_length;
          }
          local_c90 = &_force_flush_local->hashers_;
          local_ca0 = (ulong)m._4_4_;
          local_cb0 = (ulong)(uint32_t)data;
          _hasher_type = (ulong)data._4_4_;
          local_c88 = storage;
          local_c98 = puStack_dc0;
          local_ca8 = _force_flush_local;
          local_cbc = out_size_local._4_4_;
          local_c80 = _force_flush_local;
          if ((_force_flush_local->params).quality < 10) {
            if (((_force_flush_local->params).quality == 4) &&
               (0xfffff < (_force_flush_local->params).size_hint)) {
              local_c74 = 0x36;
            }
            else if ((_force_flush_local->params).quality < 5) {
              local_c74 = (_force_flush_local->params).quality;
            }
            else if ((_force_flush_local->params).lgwin < 0x11) {
              if ((_force_flush_local->params).quality < 7) {
                local_e54 = 0x28;
              }
              else {
                local_e54 = 0x2a;
                if ((_force_flush_local->params).quality < 9) {
                  local_e54 = 0x29;
                }
              }
              local_c74 = local_e54;
            }
            else {
              local_c74 = (_force_flush_local->params).quality;
            }
          }
          else {
            local_c74 = 10;
          }
          local_cc0 = local_c74;
          switch(local_c74) {
          case 2:
            InitH2((MemoryManager *)storage,local_c90->h2,puStack_dc0,&_force_flush_local->params,
                   local_cb0,_hasher_type,out_size_local._4_4_);
            local_a00 = local_c90->h2;
            local_a08 = _hasher_type;
            local_a10 = local_cb0;
            local_a18 = local_c98;
            local_a20 = local_ca0;
            if ((6 < _hasher_type) && (2 < local_cb0)) {
              _off = local_cb0 - 3;
              local_990 = local_c98;
              local_998 = local_ca0;
              local_988 = local_a00;
              local_9a4 = HashBytesH2(local_c98 + (_off & local_ca0));
              local_9a8 = 0;
              local_988->buckets_[local_9a4] = (uint32_t)_off;
              _off_1 = local_a10 - 2;
              local_9b0 = local_a00;
              local_9b8 = local_a18;
              local_9c0 = local_a20;
              local_9cc = HashBytesH2(local_a18 + (_off_1 & local_a20));
              local_9d0 = 0;
              local_9b0->buckets_[local_9cc] = (uint32_t)_off_1;
              _off_2 = local_a10 - 1;
              local_9d8 = local_a00;
              local_9e0 = local_a18;
              local_9e8 = local_a20;
              local_9f4 = HashBytesH2(local_a18 + (_off_2 & local_a20));
              local_9f8 = 0;
              local_9d8->buckets_[local_9f4] = (uint32_t)_off_2;
            }
            break;
          case 3:
            InitH3((MemoryManager *)storage,(_force_flush_local->hashers_).h3,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_960 = local_c90->h3;
            local_968 = _hasher_type;
            local_970 = local_cb0;
            local_978 = local_c98;
            local_980 = local_ca0;
            if ((6 < _hasher_type) && (2 < local_cb0)) {
              _off_3 = local_cb0 - 3;
              local_8f0 = local_c98;
              local_8f8 = local_ca0;
              local_8e8 = local_960;
              local_904 = HashBytesH3(local_c98 + (_off_3 & local_ca0));
              local_908 = (uint)(_off_3 >> 3) & 1;
              local_8e8->buckets_[local_904 + local_908] = (uint32_t)_off_3;
              _off_4 = local_970 - 2;
              local_910 = local_960;
              local_918 = local_978;
              local_920 = local_980;
              local_92c = HashBytesH3(local_978 + (_off_4 & local_980));
              local_930 = (uint)(_off_4 >> 3) & 1;
              local_910->buckets_[local_92c + local_930] = (uint32_t)_off_4;
              _off_5 = local_970 - 1;
              local_938 = local_960;
              local_940 = local_978;
              local_948 = local_980;
              local_954 = HashBytesH3(local_978 + (_off_5 & local_980));
              local_958 = (uint)(_off_5 >> 3) & 1;
              local_938->buckets_[local_954 + local_958] = (uint32_t)_off_5;
            }
            break;
          case 4:
            InitH4((MemoryManager *)storage,(_force_flush_local->hashers_).h4,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_8c0 = local_c90->h4;
            local_8c8 = _hasher_type;
            local_8d0 = local_cb0;
            local_8d8 = local_c98;
            local_8e0 = local_ca0;
            if ((6 < _hasher_type) && (2 < local_cb0)) {
              _off_6 = local_cb0 - 3;
              local_850 = local_c98;
              local_858 = local_ca0;
              local_848 = local_8c0;
              local_864 = HashBytesH4(local_c98 + (_off_6 & local_ca0));
              local_868 = (uint)(_off_6 >> 3) & 3;
              local_848->buckets_[local_864 + local_868] = (uint32_t)_off_6;
              _off_7 = local_8d0 - 2;
              local_870 = local_8c0;
              local_878 = local_8d8;
              local_880 = local_8e0;
              local_88c = HashBytesH4(local_8d8 + (_off_7 & local_8e0));
              local_890 = (uint)(_off_7 >> 3) & 3;
              local_870->buckets_[local_88c + local_890] = (uint32_t)_off_7;
              _off_8 = local_8d0 - 1;
              local_898 = local_8c0;
              local_8a0 = local_8d8;
              local_8a8 = local_8e0;
              local_8b4 = HashBytesH4(local_8d8 + (_off_8 & local_8e0));
              local_8b8 = (uint)(_off_8 >> 3) & 3;
              local_898->buckets_[local_8b4 + local_8b8] = (uint32_t)_off_8;
            }
            break;
          case 5:
            InitH5((MemoryManager *)storage,(_force_flush_local->hashers_).h5,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_820 = local_c90->h5;
            local_828 = _hasher_type;
            local_830 = local_cb0;
            local_838 = local_c98;
            local_840 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              uStack_7a8 = local_cb0 - 3;
              local_798 = local_c98;
              local_7a0 = local_ca0;
              local_790 = local_820;
              minor_ix._4_4_ = HashBytesH5(local_c98 + (uStack_7a8 & local_ca0));
              local_7b8 = (long)(int)(local_790->num_[minor_ix._4_4_] & 0xf);
              local_790->buckets_[local_7b8 + (ulong)(minor_ix._4_4_ << 4)] = (uint32_t)uStack_7a8;
              local_790->num_[minor_ix._4_4_] = local_790->num_[minor_ix._4_4_] + 1;
              uStack_7d8 = local_830 - 2;
              local_7c0 = local_820;
              local_7c8 = local_838;
              local_7d0 = local_840;
              minor_ix_1._4_4_ = HashBytesH5(local_838 + (uStack_7d8 & local_840));
              local_7e8 = (long)(int)(local_7c0->num_[minor_ix_1._4_4_] & 0xf);
              local_7c0->buckets_[local_7e8 + (ulong)(minor_ix_1._4_4_ << 4)] = (uint32_t)uStack_7d8
              ;
              local_7c0->num_[minor_ix_1._4_4_] = local_7c0->num_[minor_ix_1._4_4_] + 1;
              uStack_808 = local_830 - 1;
              local_7f0 = local_820;
              local_7f8 = local_838;
              local_800 = local_840;
              minor_ix_2._4_4_ = HashBytesH5(local_838 + (uStack_808 & local_840));
              local_818 = (long)(int)(local_7f0->num_[minor_ix_2._4_4_] & 0xf);
              local_7f0->buckets_[local_818 + (ulong)(minor_ix_2._4_4_ << 4)] = (uint32_t)uStack_808
              ;
              local_7f0->num_[minor_ix_2._4_4_] = local_7f0->num_[minor_ix_2._4_4_] + 1;
            }
            break;
          case 6:
            InitH6((MemoryManager *)storage,(_force_flush_local->hashers_).h6,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_768 = local_c90->h6;
            local_770 = _hasher_type;
            local_778 = local_cb0;
            local_780 = local_c98;
            local_788 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              uStack_6f0 = local_cb0 - 3;
              local_6e0 = local_c98;
              local_6e8 = local_ca0;
              local_6d8 = local_768;
              minor_ix_3._4_4_ = HashBytesH6(local_c98 + (uStack_6f0 & local_ca0));
              local_700 = (long)(int)(local_6d8->num_[minor_ix_3._4_4_] & 0x1f);
              local_6d8->buckets_[local_700 + (ulong)(minor_ix_3._4_4_ << 5)] = (uint32_t)uStack_6f0
              ;
              local_6d8->num_[minor_ix_3._4_4_] = local_6d8->num_[minor_ix_3._4_4_] + 1;
              uStack_720 = local_778 - 2;
              local_708 = local_768;
              local_710 = local_780;
              local_718 = local_788;
              minor_ix_4._4_4_ = HashBytesH6(local_780 + (uStack_720 & local_788));
              local_730 = (long)(int)(local_708->num_[minor_ix_4._4_4_] & 0x1f);
              local_708->buckets_[local_730 + (ulong)(minor_ix_4._4_4_ << 5)] = (uint32_t)uStack_720
              ;
              local_708->num_[minor_ix_4._4_4_] = local_708->num_[minor_ix_4._4_4_] + 1;
              uStack_750 = local_778 - 1;
              local_738 = local_768;
              local_740 = local_780;
              local_748 = local_788;
              minor_ix_5._4_4_ = HashBytesH6(local_780 + (uStack_750 & local_788));
              local_760 = (long)(int)(local_738->num_[minor_ix_5._4_4_] & 0x1f);
              local_738->buckets_[local_760 + (ulong)(minor_ix_5._4_4_ << 5)] = (uint32_t)uStack_750
              ;
              local_738->num_[minor_ix_5._4_4_] = local_738->num_[minor_ix_5._4_4_] + 1;
            }
            break;
          case 7:
            InitH7((MemoryManager *)storage,(_force_flush_local->hashers_).h7,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_6b0 = local_c90->h7;
            local_6b8 = _hasher_type;
            local_6c0 = local_cb0;
            local_6c8 = local_c98;
            local_6d0 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              uStack_638 = local_cb0 - 3;
              local_628 = local_c98;
              local_630 = local_ca0;
              local_620 = local_6b0;
              minor_ix_6._4_4_ = HashBytesH7(local_c98 + (uStack_638 & local_ca0));
              local_648 = (long)(int)(local_620->num_[minor_ix_6._4_4_] & 0x3f);
              local_620->buckets_[local_648 + (ulong)(minor_ix_6._4_4_ << 6)] = (uint32_t)uStack_638
              ;
              local_620->num_[minor_ix_6._4_4_] = local_620->num_[minor_ix_6._4_4_] + 1;
              uStack_668 = local_6c0 - 2;
              local_650 = local_6b0;
              local_658 = local_6c8;
              local_660 = local_6d0;
              minor_ix_7._4_4_ = HashBytesH7(local_6c8 + (uStack_668 & local_6d0));
              local_678 = (long)(int)(local_650->num_[minor_ix_7._4_4_] & 0x3f);
              local_650->buckets_[local_678 + (ulong)(minor_ix_7._4_4_ << 6)] = (uint32_t)uStack_668
              ;
              local_650->num_[minor_ix_7._4_4_] = local_650->num_[minor_ix_7._4_4_] + 1;
              uStack_698 = local_6c0 - 1;
              local_680 = local_6b0;
              local_688 = local_6c8;
              local_690 = local_6d0;
              minor_ix_8._4_4_ = HashBytesH7(local_6c8 + (uStack_698 & local_6d0));
              local_6a8 = (long)(int)(local_680->num_[minor_ix_8._4_4_] & 0x3f);
              local_680->buckets_[local_6a8 + (ulong)(minor_ix_8._4_4_ << 6)] = (uint32_t)uStack_698
              ;
              local_680->num_[minor_ix_8._4_4_] = local_680->num_[minor_ix_8._4_4_] + 1;
            }
            break;
          case 8:
            InitH8((MemoryManager *)storage,(_force_flush_local->hashers_).h8,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_5f8 = local_c90->h8;
            local_600 = _hasher_type;
            local_608 = local_cb0;
            local_610 = local_c98;
            local_618 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              uStack_580 = local_cb0 - 3;
              local_570 = local_c98;
              local_578 = local_ca0;
              local_568 = local_5f8;
              minor_ix_9._4_4_ = HashBytesH8(local_c98 + (uStack_580 & local_ca0));
              local_590 = (long)(int)(local_568->num_[minor_ix_9._4_4_] & 0x7f);
              local_568->buckets_[local_590 + (ulong)(minor_ix_9._4_4_ << 7)] = (uint32_t)uStack_580
              ;
              local_568->num_[minor_ix_9._4_4_] = local_568->num_[minor_ix_9._4_4_] + 1;
              uStack_5b0 = local_608 - 2;
              local_598 = local_5f8;
              local_5a0 = local_610;
              local_5a8 = local_618;
              minor_ix_10._4_4_ = HashBytesH8(local_610 + (uStack_5b0 & local_618));
              local_5c0 = (long)(int)(local_598->num_[minor_ix_10._4_4_] & 0x7f);
              local_598->buckets_[local_5c0 + (ulong)(minor_ix_10._4_4_ << 7)] =
                   (uint32_t)uStack_5b0;
              local_598->num_[minor_ix_10._4_4_] = local_598->num_[minor_ix_10._4_4_] + 1;
              uStack_5e0 = local_608 - 1;
              local_5c8 = local_5f8;
              local_5d0 = local_610;
              local_5d8 = local_618;
              minor_ix_11._4_4_ = HashBytesH8(local_610 + (uStack_5e0 & local_618));
              local_5f0 = (long)(int)(local_5c8->num_[minor_ix_11._4_4_] & 0x7f);
              local_5c8->buckets_[local_5f0 + (ulong)(minor_ix_11._4_4_ << 7)] =
                   (uint32_t)uStack_5e0;
              local_5c8->num_[minor_ix_11._4_4_] = local_5c8->num_[minor_ix_11._4_4_] + 1;
            }
            break;
          case 9:
            InitH9((MemoryManager *)storage,(_force_flush_local->hashers_).h9,puStack_dc0,
                   &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_540 = local_c90->h9;
            local_548 = _hasher_type;
            local_550 = local_cb0;
            local_558 = local_c98;
            local_560 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              uStack_4c8 = local_cb0 - 3;
              local_4b8 = local_c98;
              local_4c0 = local_ca0;
              local_4b0 = local_540;
              minor_ix_12._4_4_ = HashBytesH9(local_c98 + (uStack_4c8 & local_ca0));
              local_4d8 = (long)(int)(local_4b0->num_[minor_ix_12._4_4_] & 0xff);
              local_4b0->buckets_[local_4d8 + (ulong)(minor_ix_12._4_4_ << 8)] =
                   (uint32_t)uStack_4c8;
              local_4b0->num_[minor_ix_12._4_4_] = local_4b0->num_[minor_ix_12._4_4_] + 1;
              uStack_4f8 = local_550 - 2;
              local_4e0 = local_540;
              local_4e8 = local_558;
              local_4f0 = local_560;
              minor_ix_13._4_4_ = HashBytesH9(local_558 + (uStack_4f8 & local_560));
              local_508 = (long)(int)(local_4e0->num_[minor_ix_13._4_4_] & 0xff);
              local_4e0->buckets_[local_508 + (ulong)(minor_ix_13._4_4_ << 8)] =
                   (uint32_t)uStack_4f8;
              local_4e0->num_[minor_ix_13._4_4_] = local_4e0->num_[minor_ix_13._4_4_] + 1;
              uStack_528 = local_550 - 1;
              local_510 = local_540;
              local_518 = local_558;
              local_520 = local_560;
              minor_ix_14._4_4_ = HashBytesH9(local_558 + (uStack_528 & local_560));
              local_538 = (long)(int)(local_510->num_[minor_ix_14._4_4_] & 0xff);
              local_510->buckets_[local_538 + (ulong)(minor_ix_14._4_4_ << 8)] =
                   (uint32_t)uStack_528;
              local_510->num_[minor_ix_14._4_4_] = local_510->num_[minor_ix_14._4_4_] + 1;
            }
            break;
          case 10:
            InitH10((MemoryManager *)storage,(_force_flush_local->hashers_).h10,puStack_dc0,
                    &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            uVar7 = _hasher_type;
            local_c30 = local_c90->h10;
            local_c38 = _hasher_type;
            local_c40 = local_cb0;
            local_c48 = local_c98;
            i_start = local_ca0;
            sVar4 = HashTypeLengthH10();
            if ((sVar4 - 1 <= uVar7) && (0x7f < local_c40)) {
              max_backward = local_c40 - 0x7f;
              local_c28 = max_backward + local_c38;
              local_c20 = local_c40;
              local_e70 = local_c28;
              if (local_c40 < local_c28) {
                local_e70 = local_c40;
              }
              i = local_e70;
              i_end = max_backward;
              for (; max_backward < i; max_backward = max_backward + 1) {
                local_a58 = local_c40 - max_backward;
                local_a50 = 0xf;
                local_e80 = local_a58;
                if (local_a58 < 0xf) {
                  local_e80 = 0xf;
                }
                local_c70 = local_c30->window_mask_ - local_e80;
                local_b78 = local_c30;
                local_b80 = local_c48;
                local_b88 = max_backward;
                local_b90 = i_start;
                local_b98 = 0x80;
                local_ba8 = (ulong *)0x0;
                cur_ix_masked = 0;
                max_comp_len = max_backward & i_start;
                local_b58 = 0x80;
                local_b60 = 0x80;
                _key_36 = 0x80;
                prev_ix._4_4_ = 1;
                local_ba0 = local_c70;
                prev_ix._0_4_ = HashBytesH10(local_c48 + max_comp_len);
                uVar3 = local_b78->buckets_[(uint32_t)prev_ix];
                local_b28 = local_b78;
                local_b30 = local_b88;
                node_right = (local_b88 & local_b78->window_mask_) << 1;
                local_af8 = local_b78;
                local_b00 = local_b88;
                best_len_left = (local_b88 & local_b78->window_mask_) * 2 + 1;
                best_len_right = 0;
                depth_remaining = 0;
                if (prev_ix._4_4_ != 0) {
                  local_b78->buckets_[(uint32_t)prev_ix] = (uint32_t)local_b88;
                }
                backward = 0x40;
                while( true ) {
                  node_left = (size_t)uVar3;
                  prev_ix_masked = local_b88 - node_left;
                  cur_len = node_left & local_b90;
                  if (((prev_ix_masked == 0) || (local_ba0 < prev_ix_masked)) || (backward == 0))
                  break;
                  local_b68 = best_len_right;
                  local_b70 = depth_remaining;
                  if (best_len_right < depth_remaining) {
                    local_e90 = best_len_right;
                  }
                  else {
                    local_e90 = depth_remaining;
                  }
                  len = local_e90;
                  if (0x80 < local_e90) {
                    __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                  ,0x9d,
                                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                                 );
                  }
                  local_ac0 = local_b80 + max_comp_len + local_e90;
                  local_ac8 = (ulong *)(local_b80 + cur_len + local_e90);
                  matched = local_b98 - local_e90;
                  limit2 = 0;
                  x = (matched >> 3) + 1;
LAB_0018bbe9:
                  x = x - 1;
                  if (x != 0) {
                    t_9 = (uint64_t)local_ac8;
                    local_a80 = *local_ac8;
                    t_10 = (uint64_t)(local_ac0 + limit2);
                    local_a90 = *(ulong *)t_10;
                    if (local_a80 == local_a90) goto LAB_0018bc67;
                    t_11 = (uint64_t)local_ac8;
                    local_aa0 = *local_ac8;
                    t_12 = (uint64_t)(local_ac0 + limit2);
                    local_ab0 = *(ulong *)t_12;
                    iVar2 = 0;
                    matching_bits = local_aa0 ^ local_ab0;
                    for (uVar7 = matching_bits; (uVar7 & 1) == 0;
                        uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                      iVar2 = iVar2 + 1;
                    }
                    local_af0 = (ulong)iVar2;
                    local_ab8 = (local_af0 >> 3) + limit2;
                    goto LAB_0018bdc4;
                  }
                  matched = (matched & 7) + 1;
                  while (matched = matched - 1, matched != 0) {
                    if (local_ac0[limit2] != (uint8_t)*local_ac8) {
                      local_ab8 = limit2;
                      goto LAB_0018bdc4;
                    }
                    local_ac8 = (ulong *)((long)local_ac8 + 1);
                    limit2 = limit2 + 1;
                  }
                  local_ab8 = limit2;
LAB_0018bdc4:
                  local_c18 = local_e90 + local_ab8;
                  limit2 = local_ab8;
                  iVar2 = memcmp(local_b80 + max_comp_len,local_b80 + cur_len,local_c18);
                  if (iVar2 != 0) {
                    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                  ,0xa2,
                                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                                 );
                  }
                  if ((cur_ix_masked != 0) && (*local_ba8 < local_c18)) {
                    *local_ba8 = local_c18;
                    local_a60 = cur_ix_masked;
                    local_a68 = prev_ix_masked;
                    local_a70 = local_c18;
                    *(int *)cur_ix_masked = (int)prev_ix_masked;
                    *(int *)(cur_ix_masked + 4) = (int)(local_c18 << 5);
                    cur_ix_masked = cur_ix_masked + 8;
                  }
                  if (_key_36 <= local_c18) {
                    if (prev_ix._4_4_ != 0) {
                      local_b48 = local_b78;
                      local_b50 = node_left;
                      local_b78->forest_[node_right] =
                           local_b78->forest_[(node_left & local_b78->window_mask_) * 2];
                      local_b18 = local_b78;
                      local_b20 = node_left;
                      local_b78->forest_[best_len_left] =
                           local_b78->forest_[(node_left & local_b78->window_mask_) * 2 + 1];
                    }
                    goto LAB_0018c12c;
                  }
                  if (local_b80[cur_len + local_c18] < local_b80[max_comp_len + local_c18]) {
                    best_len_right = local_c18;
                    if (prev_ix._4_4_ != 0) {
                      local_b78->forest_[node_right] = (uint32_t)node_left;
                    }
                    local_b08 = local_b78;
                    local_b10 = node_left;
                    node_right = (node_left & local_b78->window_mask_) * 2 + 1;
                    uVar3 = local_b78->forest_[node_right];
                  }
                  else {
                    depth_remaining = local_c18;
                    if (prev_ix._4_4_ != 0) {
                      local_b78->forest_[best_len_left] = (uint32_t)node_left;
                    }
                    local_b38 = local_b78;
                    local_b40 = node_left;
                    uVar7 = node_left & local_b78->window_mask_;
                    best_len_left = uVar7 * 2;
                    uVar3 = local_b78->forest_[uVar7 * 2];
                  }
                  backward = backward - 1;
                }
                if (prev_ix._4_4_ != 0) {
                  local_b78->forest_[node_right] = local_b78->invalid_pos_;
                  local_b78->forest_[best_len_left] = local_b78->invalid_pos_;
                }
LAB_0018c12c:
              }
            }
            break;
          default:
            break;
          case 0x28:
            InitH40((MemoryManager *)storage,(_force_flush_local->hashers_).h40,puStack_dc0,
                    &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_488 = local_c90->h40;
            local_490 = _hasher_type;
            local_498 = local_cb0;
            local_4a0 = local_c98;
            local_4a8 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              key_24 = local_cb0 - 3;
              local_3d0 = local_c98;
              local_3d8 = local_ca0;
              piStack_3b8 = (int *)(local_c98 + (key_24 & local_ca0));
              local_3ac = *piStack_3b8;
              local_3bc = local_3ac * 0x1e35a7bd;
              bank = (size_t)(local_3bc >> 0x11);
              idx = 0;
              uVar1 = local_488->free_slot_idx[0];
              local_488->free_slot_idx[0] = uVar1 + 1;
              delta_1 = (size_t)(int)(uint)uVar1;
              local_400 = key_24 - local_488->addr[bank];
              local_488->tiny_hash[key_24 & 0xffff] = (uint8_t)(local_3bc >> 0x11);
              if (0xffff < local_400) {
                local_400 = 0xffff;
              }
              local_488->banks[0].slots[delta_1].delta = (uint16_t)local_400;
              local_488->banks[0].slots[delta_1].next = local_488->head[bank];
              local_488->addr[bank] = (uint32_t)key_24;
              local_488->head[bank] = uVar1;
              key_25 = local_cb0 - 2;
              local_410 = local_c98;
              local_418 = local_ca0;
              piStack_398 = (int *)(local_c98 + (key_25 & local_ca0));
              local_38c = *piStack_398;
              local_39c = local_38c * 0x1e35a7bd;
              bank_1 = (size_t)(local_39c >> 0x11);
              idx_1 = 0;
              uVar1 = local_488->free_slot_idx[0];
              local_488->free_slot_idx[0] = uVar1 + 1;
              delta_2 = (size_t)(int)(uint)uVar1;
              local_440 = key_25 - local_488->addr[bank_1];
              local_488->tiny_hash[key_25 & 0xffff] = (uint8_t)(local_39c >> 0x11);
              if (0xffff < local_440) {
                local_440 = 0xffff;
              }
              local_488->banks[0].slots[delta_2].delta = (uint16_t)local_440;
              local_488->banks[0].slots[delta_2].next = local_488->head[bank_1];
              local_488->addr[bank_1] = (uint32_t)key_25;
              local_488->head[bank_1] = uVar1;
              key_26 = local_cb0 - 1;
              local_450 = local_c98;
              local_458 = local_ca0;
              piStack_378 = (int *)(local_c98 + (key_26 & local_ca0));
              local_36c = *piStack_378;
              local_37c = local_36c * 0x1e35a7bd;
              bank_2 = (size_t)(local_37c >> 0x11);
              idx_2 = 0;
              uVar1 = local_488->free_slot_idx[0];
              local_488->free_slot_idx[0] = uVar1 + 1;
              delta_3 = (size_t)(int)(uint)uVar1;
              local_480 = key_26 - local_488->addr[bank_2];
              local_488->tiny_hash[key_26 & 0xffff] = (uint8_t)(local_37c >> 0x11);
              if (0xffff < local_480) {
                local_480 = 0xffff;
              }
              local_488->banks[0].slots[delta_3].delta = (uint16_t)local_480;
              local_488->banks[0].slots[delta_3].next = local_488->head[bank_2];
              local_488->addr[bank_2] = (uint32_t)key_26;
              local_488->head[bank_2] = uVar1;
              local_448 = local_488;
              local_408 = local_488;
              local_3c8 = local_488;
              piStack_3a8 = piStack_3b8;
              piStack_388 = piStack_398;
              piStack_368 = piStack_378;
            }
            break;
          case 0x29:
            InitH41((MemoryManager *)storage,(_force_flush_local->hashers_).h41,puStack_dc0,
                    &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_340 = local_c90->h41;
            local_348 = _hasher_type;
            local_350 = local_cb0;
            local_358 = local_c98;
            local_360 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              key_27 = local_cb0 - 3;
              local_288 = local_c98;
              local_290 = local_ca0;
              piStack_270 = (int *)(local_c98 + (key_27 & local_ca0));
              local_264 = *piStack_270;
              local_274 = local_264 * 0x1e35a7bd;
              bank_3 = (size_t)(local_274 >> 0x11);
              idx_3 = 0;
              uVar1 = local_340->free_slot_idx[0];
              local_340->free_slot_idx[0] = uVar1 + 1;
              delta_4 = (size_t)(int)(uint)uVar1;
              local_2b8 = key_27 - local_340->addr[bank_3];
              local_340->tiny_hash[key_27 & 0xffff] = (uint8_t)(local_274 >> 0x11);
              if (0xffff < local_2b8) {
                local_2b8 = 0xffff;
              }
              local_340->banks[0].slots[delta_4].delta = (uint16_t)local_2b8;
              local_340->banks[0].slots[delta_4].next = local_340->head[bank_3];
              local_340->addr[bank_3] = (uint32_t)key_27;
              local_340->head[bank_3] = uVar1;
              key_28 = local_cb0 - 2;
              local_2c8 = local_c98;
              local_2d0 = local_ca0;
              piStack_250 = (int *)(local_c98 + (key_28 & local_ca0));
              local_244 = *piStack_250;
              local_254 = local_244 * 0x1e35a7bd;
              bank_4 = (size_t)(local_254 >> 0x11);
              idx_4 = 0;
              uVar1 = local_340->free_slot_idx[0];
              local_340->free_slot_idx[0] = uVar1 + 1;
              delta_5 = (size_t)(int)(uint)uVar1;
              local_2f8 = key_28 - local_340->addr[bank_4];
              local_340->tiny_hash[key_28 & 0xffff] = (uint8_t)(local_254 >> 0x11);
              if (0xffff < local_2f8) {
                local_2f8 = 0xffff;
              }
              local_340->banks[0].slots[delta_5].delta = (uint16_t)local_2f8;
              local_340->banks[0].slots[delta_5].next = local_340->head[bank_4];
              local_340->addr[bank_4] = (uint32_t)key_28;
              local_340->head[bank_4] = uVar1;
              key_29 = local_cb0 - 1;
              local_308 = local_c98;
              local_310 = local_ca0;
              piStack_230 = (int *)(local_c98 + (key_29 & local_ca0));
              local_224 = *piStack_230;
              local_234 = local_224 * 0x1e35a7bd;
              bank_5 = (size_t)(local_234 >> 0x11);
              idx_5 = 0;
              uVar1 = local_340->free_slot_idx[0];
              local_340->free_slot_idx[0] = uVar1 + 1;
              delta_6 = (size_t)(int)(uint)uVar1;
              local_338 = key_29 - local_340->addr[bank_5];
              local_340->tiny_hash[key_29 & 0xffff] = (uint8_t)(local_234 >> 0x11);
              if (0xffff < local_338) {
                local_338 = 0xffff;
              }
              local_340->banks[0].slots[delta_6].delta = (uint16_t)local_338;
              local_340->banks[0].slots[delta_6].next = local_340->head[bank_5];
              local_340->addr[bank_5] = (uint32_t)key_29;
              local_340->head[bank_5] = uVar1;
              local_300 = local_340;
              local_2c0 = local_340;
              local_280 = local_340;
              piStack_260 = piStack_270;
              piStack_240 = piStack_250;
              piStack_220 = piStack_230;
            }
            break;
          case 0x2a:
            InitH42((MemoryManager *)storage,(_force_flush_local->hashers_).h42,puStack_dc0,
                    &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_1f8 = local_c90->h42;
            local_200 = _hasher_type;
            local_208 = local_cb0;
            local_210 = local_c98;
            local_218 = local_ca0;
            if ((2 < _hasher_type) && (2 < local_cb0)) {
              key_30 = local_cb0 - 3;
              local_140 = local_c98;
              local_148 = local_ca0;
              piStack_128 = (int *)(local_c98 + (key_30 & local_ca0));
              local_11c = *piStack_128;
              local_12c = local_11c * 0x1e35a7bd;
              bank_6 = (size_t)(local_12c >> 0x11);
              idx_6 = bank_6 & 0x1ff;
              uVar1 = local_1f8->free_slot_idx[idx_6];
              local_1f8->free_slot_idx[idx_6] = uVar1 + 1;
              uVar3 = uVar1 & 0x1ff;
              delta_7 = (size_t)(int)uVar3;
              local_170 = key_30 - local_1f8->addr[bank_6];
              local_1f8->tiny_hash[key_30 & 0xffff] = (uint8_t)(local_12c >> 0x11);
              if (0xffff < local_170) {
                local_170 = 0xffff;
              }
              local_1f8->banks[idx_6].slots[delta_7].delta = (uint16_t)local_170;
              local_1f8->banks[idx_6].slots[delta_7].next = local_1f8->head[bank_6];
              local_1f8->addr[bank_6] = (uint32_t)key_30;
              local_1f8->head[bank_6] = (uint16_t)uVar3;
              key_31 = local_cb0 - 2;
              local_180 = local_c98;
              local_188 = local_ca0;
              piStack_108 = (int *)(local_c98 + (key_31 & local_ca0));
              local_fc = *piStack_108;
              local_10c = local_fc * 0x1e35a7bd;
              bank_7 = (size_t)(local_10c >> 0x11);
              idx_7 = bank_7 & 0x1ff;
              uVar1 = local_1f8->free_slot_idx[idx_7];
              local_1f8->free_slot_idx[idx_7] = uVar1 + 1;
              uVar3 = uVar1 & 0x1ff;
              delta_8 = (size_t)(int)uVar3;
              local_1b0 = key_31 - local_1f8->addr[bank_7];
              local_1f8->tiny_hash[key_31 & 0xffff] = (uint8_t)(local_10c >> 0x11);
              if (0xffff < local_1b0) {
                local_1b0 = 0xffff;
              }
              local_1f8->banks[idx_7].slots[delta_8].delta = (uint16_t)local_1b0;
              local_1f8->banks[idx_7].slots[delta_8].next = local_1f8->head[bank_7];
              local_1f8->addr[bank_7] = (uint32_t)key_31;
              local_1f8->head[bank_7] = (uint16_t)uVar3;
              key_32 = local_cb0 - 1;
              local_1c0 = local_c98;
              local_1c8 = local_ca0;
              piStack_e8 = (int *)(local_c98 + (key_32 & local_ca0));
              local_dc = *piStack_e8;
              local_ec = local_dc * 0x1e35a7bd;
              bank_8 = (size_t)(local_ec >> 0x11);
              idx_8 = bank_8 & 0x1ff;
              uVar1 = local_1f8->free_slot_idx[idx_8];
              local_1f8->free_slot_idx[idx_8] = uVar1 + 1;
              uVar3 = uVar1 & 0x1ff;
              delta_9 = (size_t)(int)uVar3;
              local_1f0 = key_32 - local_1f8->addr[bank_8];
              local_1f8->tiny_hash[key_32 & 0xffff] = (uint8_t)(local_ec >> 0x11);
              if (0xffff < local_1f0) {
                local_1f0 = 0xffff;
              }
              local_1f8->banks[idx_8].slots[delta_9].delta = (uint16_t)local_1f0;
              local_1f8->banks[idx_8].slots[delta_9].next = local_1f8->head[bank_8];
              local_1f8->addr[bank_8] = (uint32_t)key_32;
              local_1f8->head[bank_8] = (uint16_t)uVar3;
              local_1b8 = local_1f8;
              local_178 = local_1f8;
              local_138 = local_1f8;
              piStack_118 = piStack_128;
              piStack_f8 = piStack_108;
              piStack_d8 = piStack_e8;
            }
            break;
          case 0x36:
            InitH54((MemoryManager *)storage,(_force_flush_local->hashers_).h54,puStack_dc0,
                    &_force_flush_local->params,local_cb0,_hasher_type,out_size_local._4_4_);
            local_b0 = local_c90->h54;
            local_b8 = _hasher_type;
            local_c0 = local_cb0;
            local_c8 = local_c98;
            local_d0 = local_ca0;
            if ((6 < _hasher_type) && (2 < local_cb0)) {
              _off_9 = local_cb0 - 3;
              local_40 = local_c98;
              local_48 = local_ca0;
              local_38 = local_b0;
              local_54 = HashBytesH54(local_c98 + (_off_9 & local_ca0));
              local_58 = (uint)(_off_9 >> 3) & 3;
              local_38->buckets_[local_54 + local_58] = (uint32_t)_off_9;
              _off_10 = local_c0 - 2;
              local_60 = local_b0;
              local_68 = local_c8;
              local_70 = local_d0;
              local_7c = HashBytesH54(local_c8 + (_off_10 & local_d0));
              local_80 = (uint)(_off_10 >> 3) & 3;
              local_60->buckets_[local_7c + local_80] = (uint32_t)_off_10;
              _off_11 = local_c0 - 1;
              local_88 = local_b0;
              local_90 = local_c8;
              local_98 = local_d0;
              local_a4 = HashBytesH54(local_c8 + (_off_11 & local_d0));
              local_a8 = (uint)(_off_11 >> 3) & 3;
              local_88->buckets_[local_a4 + local_a8] = (uint32_t)_off_11;
            }
          }
          if ((_force_flush_local->params).quality == 10) {
            BrotliCreateZopfliBackwardReferences
                      ((MemoryManager *)storage,(ulong)data._4_4_,(ulong)(uint32_t)data,puStack_dc0,
                       (ulong)m._4_4_,&_force_flush_local->params,(_force_flush_local->hashers_).h10
                       ,_force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                       _force_flush_local->commands_ + _force_flush_local->num_commands_,
                       &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
          }
          else if ((_force_flush_local->params).quality == 0xb) {
            BrotliCreateHqZopfliBackwardReferences
                      ((MemoryManager *)storage,(ulong)data._4_4_,(ulong)(uint32_t)data,puStack_dc0,
                       (ulong)m._4_4_,&_force_flush_local->params,(_force_flush_local->hashers_).h10
                       ,_force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                       _force_flush_local->commands_ + _force_flush_local->num_commands_,
                       &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
          }
          else {
            BrotliCreateBackwardReferences
                      ((ulong)data._4_4_,(ulong)(uint32_t)data,puStack_dc0,(ulong)m._4_4_,
                       &_force_flush_local->params,&_force_flush_local->hashers_,
                       _force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                       _force_flush_local->commands_ + _force_flush_local->num_commands_,
                       &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
          }
          pBStack_a40 = _force_flush_local;
          local_a30 = _force_flush_local;
          local_a24 = (_force_flush_local->params).lgwin;
          local_a28 = (_force_flush_local->params).lgblock;
          local_e9c = local_a28;
          if (local_a28 < local_a24) {
            local_e9c = local_a24;
          }
          local_a34 = local_e9c + 1;
          local_a38 = 0x18;
          local_ea0 = local_a34;
          if (0x17 < local_a34) {
            local_ea0 = 0x18;
          }
          local_a44 = local_ea0;
          max_literals = 1L << ((byte)local_ea0 & 0x3f);
          max_commands = max_literals >> 3;
          processed_bytes = max_literals >> 3;
          lVar8 = _force_flush_local->input_pos_ - _force_flush_local->last_flush_pos_;
          _should_flush = lVar8;
          sVar4 = InputBlockSize(_force_flush_local);
          metablock_size = (uint32_t)(lVar8 + sVar4 <= max_literals);
          bVar9 = false;
          if ((_force_flush_local->params).quality < 4) {
            bVar9 = 0x2ffe < _force_flush_local->num_literals_ + _force_flush_local->num_commands_;
          }
          local_e28 = (uint)bVar9;
          if (((((out_size_local._4_4_ == 0) && ((int)out_size_local == 0)) && (local_e28 == 0)) &&
              ((metablock_size != 0 && (_force_flush_local->num_literals_ < max_commands)))) &&
             (_force_flush_local->num_commands_ < processed_bytes)) {
            iVar2 = UpdateLastProcessedPos(_force_flush_local);
            if (iVar2 != 0) {
              local_d50 = &_force_flush_local->hashers_;
              local_d70 = _force_flush_local;
              if ((_force_flush_local->params).quality < 10) {
                if (((_force_flush_local->params).quality == 4) &&
                   (0xfffff < (_force_flush_local->params).size_hint)) {
                  local_d68 = 0x36;
                }
                else if ((_force_flush_local->params).quality < 5) {
                  local_d68 = (_force_flush_local->params).quality;
                }
                else if ((_force_flush_local->params).lgwin < 0x11) {
                  if ((_force_flush_local->params).quality < 7) {
                    local_ebc = 0x28;
                  }
                  else {
                    local_ebc = 0x2a;
                    if ((_force_flush_local->params).quality < 9) {
                      local_ebc = 0x29;
                    }
                  }
                  local_d68 = local_ebc;
                }
                else {
                  local_d68 = (_force_flush_local->params).quality;
                }
              }
              else {
                local_d68 = 10;
              }
              local_d54 = local_d68;
              switch(local_d68) {
              case 2:
                ResetH2(local_d50->h2);
                break;
              case 3:
                ResetH3((_force_flush_local->hashers_).h3);
                break;
              case 4:
                ResetH4((_force_flush_local->hashers_).h4);
                break;
              case 5:
                ResetH5((_force_flush_local->hashers_).h5);
                break;
              case 6:
                ResetH6((_force_flush_local->hashers_).h6);
                break;
              case 7:
                ResetH7((_force_flush_local->hashers_).h7);
                break;
              case 8:
                ResetH8((_force_flush_local->hashers_).h8);
                break;
              case 9:
                ResetH9((_force_flush_local->hashers_).h9);
                break;
              case 10:
                ResetH10((_force_flush_local->hashers_).h10);
                break;
              default:
                break;
              case 0x28:
                ResetH40((_force_flush_local->hashers_).h40);
                break;
              case 0x29:
                ResetH41((_force_flush_local->hashers_).h41);
                break;
              case 0x2a:
                ResetH42((_force_flush_local->hashers_).h42);
                break;
              case 0x36:
                ResetH54((_force_flush_local->hashers_).h54);
              }
            }
            *output_local = (uint8_t *)0x0;
            s_local._4_4_ = 1;
          }
          else {
            if (_force_flush_local->last_insert_len_ != 0) {
              sVar4 = _force_flush_local->num_commands_;
              _force_flush_local->num_commands_ = sVar4 + 1;
              local_d40 = _force_flush_local->commands_ + sVar4;
              local_d48 = _force_flush_local->last_insert_len_;
              local_d40->insert_len_ = (uint32_t)local_d48;
              local_d40->copy_len_ = 0x4000000;
              local_d40->dist_extra_ = 0;
              local_d40->dist_prefix_ = 0x10;
              puStack_d30 = &local_d40->cmd_prefix_;
              local_d20 = 4;
              local_d24 = 0;
              if (local_d48 < 6) {
                local_cfe = (ushort)local_d48;
              }
              else if (local_d48 < 0x82) {
                local_cd0 = local_d48 - 2;
                local_d0c = 0x1f;
                if ((uint)local_cd0 != 0) {
                  for (; (uint)local_cd0 >> local_d0c == 0; local_d0c = local_d0c + -1) {
                  }
                }
                local_d0c = local_d0c + -1;
                local_cfe = (short)local_d0c * 2 +
                            (short)(local_d48 - 2 >> ((byte)local_d0c & 0x3f)) + 2;
              }
              else if (local_d48 < 0x842) {
                local_cc8 = local_d48 - 0x42;
                iVar2 = 0x1f;
                if ((uint)local_cc8 != 0) {
                  for (; (uint)local_cc8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                  }
                }
                local_cfe = (short)iVar2 + 10;
              }
              else if (local_d48 < 0x1842) {
                local_cfe = 0x15;
              }
              else if (local_d48 < 0x5842) {
                local_cfe = 0x16;
              }
              else {
                local_cfe = 0x17;
              }
              local_d32 = local_cfe;
              uStack_cf8 = 4;
              local_cf0 = 2;
              local_d34 = 2;
              local_ce4 = local_cfe;
              bits64 = 2;
              local_cec = 0;
              local_cee = (local_cfe & 7) << 3 | 2;
              local_ce2 = *(ushort *)
                           (CombineLengthCodes_cells + (long)(((int)(uint)local_cfe >> 3) * 3) * 2)
                          | local_cee;
              *puStack_d30 = local_ce2;
              _force_flush_local->num_literals_ =
                   _force_flush_local->last_insert_len_ + _force_flush_local->num_literals_;
              _force_flush_local->last_insert_len_ = 0;
              local_d18 = local_d48;
              uStack_d08 = local_d48;
            }
            if ((out_size_local._4_4_ == 0) &&
               (_force_flush_local->input_pos_ == _force_flush_local->last_flush_pos_)) {
              *output_local = (uint8_t *)0x0;
              s_local._4_4_ = 1;
            }
            else {
              if (_force_flush_local->input_pos_ < _force_flush_local->last_flush_pos_) {
                __assert_fail("s->input_pos_ >= s->last_flush_pos_",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                              ,0x3bf,
                              "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                             );
              }
              if ((_force_flush_local->input_pos_ <= _force_flush_local->last_flush_pos_) &&
                 (out_size_local._4_4_ == 0)) {
                __assert_fail("s->input_pos_ > s->last_flush_pos_ || is_last",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                              ,0x3c0,
                              "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                             );
              }
              if (0x1000000 < _force_flush_local->input_pos_ - _force_flush_local->last_flush_pos_)
              {
                __assert_fail("s->input_pos_ - s->last_flush_pos_ <= 1u << 24",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                              ,0x3c1,
                              "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                             );
              }
              storage_1._4_4_ =
                   (int)_force_flush_local->input_pos_ - (int)_force_flush_local->last_flush_pos_;
              storage_ix_1 = (size_t)GetBrotliStorage(_force_flush_local,
                                                      (ulong)(storage_1._4_4_ * 2 + 0x1f6));
              local_e40 = (ulong)_force_flush_local->last_byte_bits_;
              *(uint8_t *)storage_ix_1 = _force_flush_local->last_byte_;
              WriteMetaBlockInternal
                        ((MemoryManager *)storage,puStack_dc0,(ulong)m._4_4_,
                         _force_flush_local->last_flush_pos_,(ulong)storage_1._4_4_,
                         out_size_local._4_4_,&_force_flush_local->params,
                         _force_flush_local->prev_byte_,_force_flush_local->prev_byte2_,
                         _force_flush_local->num_literals_,_force_flush_local->num_commands_,
                         _force_flush_local->commands_,_force_flush_local->saved_dist_cache_,
                         _force_flush_local->dist_cache_,&local_e40,(uint8_t *)storage_ix_1);
              _force_flush_local->last_byte_ = *(uint8_t *)(storage_ix_1 + (local_e40 >> 3));
              _force_flush_local->last_byte_bits_ = (byte)local_e40 & 7;
              _force_flush_local->last_flush_pos_ = _force_flush_local->input_pos_;
              iVar2 = UpdateLastProcessedPos(_force_flush_local);
              if (iVar2 != 0) {
                local_d60 = &_force_flush_local->hashers_;
                local_d80 = _force_flush_local;
                if ((_force_flush_local->params).quality < 10) {
                  if (((_force_flush_local->params).quality == 4) &&
                     (0xfffff < (_force_flush_local->params).size_hint)) {
                    local_d74 = 0x36;
                  }
                  else if ((_force_flush_local->params).quality < 5) {
                    local_d74 = (_force_flush_local->params).quality;
                  }
                  else if ((_force_flush_local->params).lgwin < 0x11) {
                    if ((_force_flush_local->params).quality < 7) {
                      local_eec = 0x28;
                    }
                    else {
                      local_eec = 0x2a;
                      if ((_force_flush_local->params).quality < 9) {
                        local_eec = 0x29;
                      }
                    }
                    local_d74 = local_eec;
                  }
                  else {
                    local_d74 = (_force_flush_local->params).quality;
                  }
                }
                else {
                  local_d74 = 10;
                }
                local_d64 = local_d74;
                switch(local_d74) {
                case 2:
                  ResetH2(local_d60->h2);
                  break;
                case 3:
                  ResetH3((_force_flush_local->hashers_).h3);
                  break;
                case 4:
                  ResetH4((_force_flush_local->hashers_).h4);
                  break;
                case 5:
                  ResetH5((_force_flush_local->hashers_).h5);
                  break;
                case 6:
                  ResetH6((_force_flush_local->hashers_).h6);
                  break;
                case 7:
                  ResetH7((_force_flush_local->hashers_).h7);
                  break;
                case 8:
                  ResetH8((_force_flush_local->hashers_).h8);
                  break;
                case 9:
                  ResetH9((_force_flush_local->hashers_).h9);
                  break;
                case 10:
                  ResetH10((_force_flush_local->hashers_).h10);
                  break;
                default:
                  break;
                case 0x28:
                  ResetH40((_force_flush_local->hashers_).h40);
                  break;
                case 0x29:
                  ResetH41((_force_flush_local->hashers_).h41);
                  break;
                case 0x2a:
                  ResetH42((_force_flush_local->hashers_).h42);
                  break;
                case 0x36:
                  ResetH54((_force_flush_local->hashers_).h54);
                }
              }
              if (_force_flush_local->last_flush_pos_ != 0) {
                _force_flush_local->prev_byte_ =
                     puStack_dc0[(int)_force_flush_local->last_flush_pos_ - 1U & m._4_4_];
              }
              if (1 < _force_flush_local->last_flush_pos_) {
                _force_flush_local->prev_byte2_ =
                     puStack_dc0[(int)_force_flush_local->last_flush_pos_ - 2U & m._4_4_];
              }
              _force_flush_local->num_commands_ = 0;
              _force_flush_local->num_literals_ = 0;
              *(undefined8 *)_force_flush_local->saved_dist_cache_ =
                   *(undefined8 *)_force_flush_local->dist_cache_;
              *(undefined8 *)(_force_flush_local->saved_dist_cache_ + 2) =
                   *(undefined8 *)(_force_flush_local->dist_cache_ + 2);
              *(size_t *)delta = storage_ix_1;
              *output_local = (uint8_t *)(local_e40 >> 3);
              s_local._4_4_ = 1;
            }
          }
        }
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
LAB_0018bc67:
  local_ac8 = local_ac8 + 1;
  limit2 = limit2 + 8;
  goto LAB_0018bbe9;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  const uint32_t bytes = (uint32_t)delta;
  const uint32_t wrapped_last_processed_pos =
      WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_byte_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 502);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hashers_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);
  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BrotliCreateZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BrotliCreateHqZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos, data, mask,
        &s->params, &s->hashers_, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HashersReset(&s->hashers_, ChooseHasher(&s->params));
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  assert(s->input_pos_ >= s->last_flush_pos_);
  assert(s->input_pos_ > s->last_flush_pos_ || is_last);
  assert(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 502);
    size_t storage_ix = s->last_byte_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HashersReset(&s->hashers_, ChooseHasher(&s->params));
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}